

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::NnPredictTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::NnPredictTest_DISABLED_Speed_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*const)(float_const*,NN_CONFIG_const*,int,float*)>>::parameter_
       = &this->parameter_;
  this_00 = (Test *)operator_new(0xe8);
  Test::Test(this_00);
  *(undefined4 *)&this_00[2]._vptr_Test = 0xbaba;
  memset(&this_00[2].gtest_flag_saver_,0,0xc0);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010516f0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__NnPredictTest_DISABLED_Speed_Test_01051730;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }